

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gsl.cpp
# Opt level: O3

void __thiscall GslSpan_CbeginCend_Test::~GslSpan_CbeginCend_Test(GslSpan_CbeginCend_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (GslSpan, CbeginCend) {
    {
        int a[] = {1, 2, 3, 4};
        span<int> s = make_span (a);

        span<int>::const_iterator cit = s.begin ();
        span<int>::const_iterator cit2 = std::begin (s);
        EXPECT_EQ (cit, cit2);

        cit = s.end ();
        cit2 = std::end (s);
        EXPECT_EQ (cit, cit2);
    }
    {
        int a[] = {1, 2, 3, 4};
        span<int> s = make_span (a);

        auto it = s.cbegin ();
        auto first = it;
        EXPECT_EQ (it, first);
        EXPECT_EQ (*it, 1);

        auto beyond = s.cend ();
        EXPECT_NE (it, beyond);

        EXPECT_EQ (beyond - first, 4);
        EXPECT_EQ (first - first, 0);
        EXPECT_EQ (beyond - beyond, 0);

        ++it;
        EXPECT_EQ (it - first, 1);
        EXPECT_EQ (*it, 2);
        EXPECT_EQ (beyond - it, 3);

        int last = 0;
        it = first;
        EXPECT_EQ (it, first);
        while (it != s.cend ()) {
            EXPECT_EQ (*it, last + 1);

            last = *it;
            ++it;
        }

        EXPECT_EQ (it, beyond);
        EXPECT_EQ (it - beyond, 0);
    }
}